

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

StatusOr<google::protobuf::FileDescriptorProto> * __thiscall
google::protobuf::descriptor_unittest::ParameterizeFileProto
          (StatusOr<google::protobuf::FileDescriptorProto> *__return_storage_ptr__,
          descriptor_unittest *this,string_view file_text,ExtensionDeclarationsTestParams *param)

{
  bool bVar1;
  Message *output;
  string_view input;
  string_view message;
  FileDescriptorProto file_proto;
  Status local_120;
  FileDescriptorProto local_118;
  
  output = (Message *)file_text._M_str;
  FileDescriptorProto::FileDescriptorProto(&local_118,(Arena *)0x0);
  input._M_str = (char *)&local_118;
  input._M_len = file_text._M_len;
  bVar1 = TextFormat::ParseFromString((TextFormat *)this,input,output);
  if (bVar1) {
    FileDescriptorProto::FileDescriptorProto
              (&(__return_storage_ptr__->super_StatusOrData<google::protobuf::FileDescriptorProto>).
                field_1.data_,(Arena *)0x0,&local_118);
    (__return_storage_ptr__->super_StatusOrData<google::protobuf::FileDescriptorProto>).field_0 =
         (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FileDescriptorProto>_1)0x1;
  }
  else {
    message._M_str = (char *)0x24;
    message._M_len = (size_t)&local_120;
    absl::lts_20250127::InvalidArgumentError(message);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FileDescriptorProto>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FileDescriptorProto>,
               &local_120);
    if ((local_120.rep_ & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_120.rep_);
    }
  }
  FileDescriptorProto::~FileDescriptorProto(&local_118);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FileDescriptorProto> ParameterizeFileProto(
    absl::string_view file_text, const ExtensionDeclarationsTestParams& param) {
  (void)file_text;  // Parameter is used by Google-internal code.
  (void)param;      // Parameter is used by Google-internal code.
  FileDescriptorProto file_proto;
  if (!TextFormat::ParseFromString(file_text, &file_proto)) {
    return absl::InvalidArgumentError("Failed to parse the input file text.");
  }

  return file_proto;
}